

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessSessionIdJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *param_2)

{
  bool bVar1;
  element_type *peVar2;
  Value *this_00;
  string local_118;
  Value local_f8;
  ErrorCode local_b0 [4];
  Error local_a0;
  Value local_78;
  ushort local_2c;
  undefined1 local_29;
  uint16_t sessionId;
  Expression *pEStack_28;
  Expression *param_2_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  Value *value;
  
  local_29 = 0;
  pEStack_28 = param_2;
  param_2_local = (Expression *)aCommissioner;
  aCommissioner_local = (CommissionerAppPtr *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)param_2_local);
  (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x12])(&local_a0,peVar2,&local_2c)
  ;
  Value::Value(&local_78,&local_a0);
  this_00 = Value::operator=(__return_storage_ptr__,&local_78);
  local_b0[0] = kNone;
  bVar1 = Value::operator!=(this_00,local_b0);
  Value::~Value(&local_78);
  Error::~Error(&local_a0);
  if (!bVar1) {
    std::__cxx11::to_string(&local_118,(uint)local_2c);
    Value::Value(&local_f8,&local_118);
    Value::operator=(__return_storage_ptr__,&local_f8);
    Value::~Value(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessSessionIdJob(CommissionerAppPtr &aCommissioner, const Expression &)
{
    Value    value;
    uint16_t sessionId;

    SuccessOrExit(value = aCommissioner->GetSessionId(sessionId));
    value = std::to_string(sessionId);

exit:
    return value;
}